

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImGuiStyleMod>::push_back(ImVector<ImGuiStyleMod> *this,ImGuiStyleMod *v)

{
  ImGuiStyleMod *pIVar1;
  int iVar2;
  int iVar3;
  int new_capacity;
  
  iVar3 = this->Size;
  if (iVar3 == this->Capacity) {
    if (iVar3 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar3 / 2 + iVar3;
    }
    new_capacity = iVar3 + 1;
    if (iVar3 + 1 < iVar2) {
      new_capacity = iVar2;
    }
    reserve(this,new_capacity);
    iVar3 = this->Size;
  }
  pIVar1 = this->Data;
  pIVar1[iVar3].field_1.BackupInt[1] = (v->field_1).BackupInt[1];
  *(undefined8 *)(pIVar1 + iVar3) = *(undefined8 *)v;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }